

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol.c
# Opt level: O0

void KINFree(void **kinmem)

{
  KINMem kin_mem_00;
  KINMem kin_mem;
  void **kinmem_local;
  
  if (*kinmem != (void *)0x0) {
    kin_mem_00 = (KINMem)*kinmem;
    KINFreeVectors(kin_mem_00);
    if (kin_mem_00->kin_lfree != (_func_int_KINMemRec_ptr *)0x0) {
      (*kin_mem_00->kin_lfree)(kin_mem_00);
    }
    free(*kinmem);
    *kinmem = (void *)0x0;
  }
  return;
}

Assistant:

void KINFree(void **kinmem)
{
  KINMem kin_mem;

  if (*kinmem == NULL) return;

  kin_mem = (KINMem) (*kinmem);
  KINFreeVectors(kin_mem);

  /* call lfree if non-NULL */

  if (kin_mem->kin_lfree != NULL) kin_mem->kin_lfree(kin_mem);

  free(*kinmem);
  *kinmem = NULL;
}